

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lemon.c
# Opt level: O1

acttab * acttab_alloc(void)

{
  int *piVar1;
  long lVar2;
  long lVar3;
  bool bVar4;
  uint uVar5;
  int iVar6;
  uint uVar7;
  uint uVar8;
  acttab *paVar9;
  void *pvVar10;
  long lVar11;
  void *pvVar12;
  ulong uVar13;
  undefined4 extraout_EDX;
  long lVar14;
  int iVar15;
  int iVar16;
  long lVar17;
  uint *__ptr;
  ulong uVar18;
  long lVar19;
  ulong uVar20;
  uint uVar21;
  
  lVar17 = 1;
  iVar6 = 0x30;
  paVar9 = (acttab *)calloc(1,0x30);
  if (paVar9 != (acttab *)0x0) {
    paVar9->mxLookahead = 0;
    paVar9->nLookahead = 0;
    *(undefined8 *)&paVar9->nLookaheadAlloc = 0;
    paVar9->aLookahead = (lookahead_action *)0x0;
    paVar9->mnLookahead = 0;
    paVar9->mnAction = 0;
    paVar9->nAction = 0;
    paVar9->nActionAlloc = 0;
    paVar9->aAction = (lookahead_action *)0x0;
    return paVar9;
  }
  acttab_alloc_cold_1();
  iVar16 = *(int *)(lVar17 + 0x28);
  if (iVar16 <= *(int *)(lVar17 + 0x24)) {
    *(int *)(lVar17 + 0x28) = iVar16 + 0x19;
    __ptr = *(uint **)(lVar17 + 0x10);
    pvVar10 = realloc(__ptr,(long)iVar16 * 8 + 200);
    *(void **)(lVar17 + 0x10) = pvVar10;
    if (pvVar10 == (void *)0x0) {
      acttab_action_cold_1();
      if ((int)__ptr[9] < 1) {
        __assert_fail("p->nLookahead>0",
                      "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/tools/lemon/lemon.c"
                      ,0x229,"int acttab_insert(acttab *)");
      }
      iVar6 = *__ptr + __ptr[8] + 1;
      uVar5 = __ptr[1];
      if ((int)uVar5 <= iVar6) {
        uVar7 = iVar6 + uVar5 + 0x14;
        __ptr[1] = uVar7;
        pvVar10 = *(void **)(__ptr + 2);
        pvVar12 = realloc(pvVar10,(long)(int)uVar7 << 3);
        *(void **)(__ptr + 2) = pvVar12;
        if (pvVar12 == (void *)0x0) {
          acttab_insert_cold_1();
          lVar17 = *(long *)((long)pvVar10 + 8);
          do {
            if (lVar17 == 0) {
              return (acttab *)0x0;
            }
            if ((*(long *)(lVar17 + 0x50) == 0) && (0 < (long)*(int *)(lVar17 + 0x18))) {
              lVar11 = *(long *)(lVar17 + 0x50);
              lVar14 = 0;
              do {
                if (lVar11 != 0) break;
                lVar2 = *(long *)(*(long *)(lVar17 + 0x20) + lVar14 * 8);
                if (*(int *)(lVar2 + 0xc) == 2) {
                  if (0 < (long)*(int *)(lVar2 + 0x54)) {
                    lVar19 = 0;
                    do {
                      lVar3 = *(long *)(*(long *)(lVar2 + 0x58) + lVar19 * 8);
                      if (-1 < *(int *)(lVar3 + 0x20)) goto LAB_00103df8;
                      lVar19 = lVar19 + 1;
                    } while (*(int *)(lVar2 + 0x54) != lVar19);
                  }
                }
                else {
                  lVar3 = lVar2;
                  if (-1 < *(int *)(lVar2 + 0x20)) {
LAB_00103df8:
                    lVar11 = lVar3;
                    *(long *)(lVar17 + 0x50) = lVar11;
                  }
                }
                lVar14 = lVar14 + 1;
              } while (lVar14 != *(int *)(lVar17 + 0x18));
            }
            lVar17 = *(long *)(lVar17 + 0x70);
          } while( true );
        }
        if ((int)uVar5 < (int)__ptr[1]) {
          memset((void *)((long)pvVar12 + (long)(int)uVar5 * 8),0xff,
                 (ulong)(__ptr[1] + ~uVar5) * 8 + 8);
        }
      }
      uVar5 = *__ptr;
      uVar7 = uVar5 - 1;
      if ((int)uVar5 < 1) {
        bVar4 = true;
      }
      else {
        lVar17 = *(long *)(__ptr + 2);
        uVar8 = __ptr[6];
        iVar6 = uVar8 - uVar5;
        uVar18 = (ulong)uVar5;
        uVar13 = (ulong)uVar7;
        do {
          iVar6 = iVar6 + 1;
          iVar16 = (int)uVar18;
          if ((*(uint *)(lVar17 + uVar13 * 8) == uVar8) &&
             (*(uint *)(lVar17 + 4 + uVar13 * 8) == __ptr[7])) {
            uVar18 = (ulong)(int)__ptr[9];
            bVar4 = 0 < (long)uVar18;
            if (0 < (long)uVar18) {
              piVar1 = *(int **)(__ptr + 4);
              iVar15 = *piVar1;
              uVar7 = (iVar15 - uVar8) + (int)uVar13;
              if (uVar7 < uVar5) {
                uVar20 = 1;
                do {
                  if ((iVar15 != *(int *)(lVar17 + (ulong)uVar7 * 8)) ||
                     (piVar1[uVar20 * 2 + -1] != *(int *)(lVar17 + 4 + (ulong)uVar7 * 8))) break;
                  if (uVar18 == uVar20) goto LAB_00103c17;
                  bVar4 = uVar20 < uVar18;
                  iVar15 = piVar1[uVar20 * 2];
                  uVar7 = (iVar15 - uVar8) + (int)uVar13;
                  uVar20 = uVar20 + 1;
                } while (uVar7 < uVar5);
              }
              if (bVar4) goto LAB_00103c49;
            }
LAB_00103c17:
            uVar18 = 0;
            uVar7 = 0;
            do {
              iVar15 = *(int *)(lVar17 + uVar18 * 8);
              uVar7 = uVar7 + (iVar6 + (int)uVar18 == iVar15 && -1 < iVar15);
              uVar18 = uVar18 + 1;
            } while (uVar5 != uVar18);
            if (uVar7 == __ptr[9]) goto LAB_00103c65;
          }
LAB_00103c49:
          uVar18 = uVar13 & 0xffffffff;
          bVar4 = 0 < (long)uVar13;
          uVar13 = uVar13 - 1;
        } while (bVar4);
        uVar13 = 0xffffffff;
        iVar16 = 0;
LAB_00103c65:
        uVar7 = (uint)uVar13;
        bVar4 = iVar16 < 1;
      }
      if (bVar4) {
        uVar8 = __ptr[1] - __ptr[8];
        if (uVar8 == 0 || (int)__ptr[1] < (int)__ptr[8]) {
          uVar7 = 0;
        }
        else {
          lVar17 = *(long *)(__ptr + 2);
          iVar6 = 0;
          uVar13 = 0;
          do {
            if (*(int *)(lVar17 + uVar13 * 8) < 0) {
              uVar18 = (ulong)(int)__ptr[9];
              bVar4 = 0 < (long)uVar18;
              uVar7 = (uint)uVar13;
              if (0 < (long)uVar18) {
                uVar21 = (**(int **)(__ptr + 4) - __ptr[6]) + uVar7;
                if (-1 < (int)uVar21) {
                  uVar20 = 1;
                  do {
                    if (-1 < *(int *)(lVar17 + (ulong)uVar21 * 8)) break;
                    if (uVar18 == uVar20) goto LAB_00103ce1;
                    bVar4 = uVar20 < uVar18;
                    lVar11 = uVar20 * 2;
                    uVar20 = uVar20 + 1;
                    uVar21 = ((*(int **)(__ptr + 4))[lVar11] - __ptr[6]) + uVar7;
                  } while (-1 < (int)uVar21);
                }
                if (bVar4) goto LAB_00103d0e;
              }
LAB_00103ce1:
              if ((int)uVar5 < 1) {
                uVar18 = 0;
              }
              else {
                uVar18 = 0;
                do {
                  if (__ptr[6] + iVar6 + (int)uVar18 == *(int *)(lVar17 + uVar18 * 8))
                  goto LAB_00103d09;
                  uVar18 = uVar18 + 1;
                } while (uVar5 != uVar18);
                uVar18 = (ulong)uVar5;
              }
LAB_00103d09:
              if ((uint)uVar18 == uVar5) break;
            }
LAB_00103d0e:
            uVar13 = uVar13 + 1;
            iVar6 = iVar6 + -1;
            uVar7 = uVar8;
          } while (uVar13 != uVar8);
        }
      }
      if (0 < (int)__ptr[9]) {
        lVar17 = 0;
        do {
          iVar6 = (*(int *)(*(long *)(__ptr + 4) + lVar17 * 8) - __ptr[6]) + uVar7;
          *(undefined8 *)(*(long *)(__ptr + 2) + (long)iVar6 * 8) =
               *(undefined8 *)(*(long *)(__ptr + 4) + lVar17 * 8);
          if ((int)*__ptr <= iVar6) {
            *__ptr = iVar6 + 1;
          }
          lVar17 = lVar17 + 1;
        } while (lVar17 < (int)__ptr[9]);
      }
      __ptr[9] = 0;
      return (acttab *)(ulong)(uVar7 - __ptr[6]);
    }
  }
  iVar16 = *(int *)(lVar17 + 0x24);
  lVar11 = (long)iVar16;
  if (lVar11 == 0) {
    *(int *)(lVar17 + 0x20) = iVar6;
  }
  else {
    if (*(int *)(lVar17 + 0x20) < iVar6) {
      *(int *)(lVar17 + 0x20) = iVar6;
    }
    if (*(int *)(lVar17 + 0x18) <= iVar6) goto LAB_00103af2;
  }
  *(int *)(lVar17 + 0x18) = iVar6;
  *(undefined4 *)(lVar17 + 0x1c) = extraout_EDX;
LAB_00103af2:
  lVar14 = *(long *)(lVar17 + 0x10);
  *(int *)(lVar14 + lVar11 * 8) = iVar6;
  *(undefined4 *)(lVar14 + 4 + lVar11 * 8) = extraout_EDX;
  uVar5 = iVar16 + 1;
  *(uint *)(lVar17 + 0x24) = uVar5;
  return (acttab *)(ulong)uVar5;
}

Assistant:

acttab *acttab_alloc(void){
  acttab *p = (acttab *) calloc( 1, sizeof(*p) );
  if( p==0 ){
    fprintf(stderr,"Unable to allocate memory for a new acttab.");
    exit(1);
  }
  memset(p, 0, sizeof(*p));
  return p;
}